

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::AddIncludeDirectories
          (cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *incs,bool before)

{
  bool bVar1;
  pointer ppVar2;
  cmTarget *t;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  local_f0;
  iterator l;
  const_iterator local_e0;
  string local_c8;
  undefined1 local_a8 [8];
  cmValueWithOrigin entry;
  cmListFileBacktrace lfbt;
  iterator position;
  bool before_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *incs_local;
  cmMakefile *this_local;
  
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(incs);
  if (!bVar1) {
    if (before) {
      lfbt.Snapshot.Position.Position =
           (PositionType)
           std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::begin
                     (&this->IncludeDirectoriesEntries);
    }
    else {
      lfbt.Snapshot.Position.Position =
           (PositionType)
           std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::end
                     (&this->IncludeDirectoriesEntries);
    }
    GetBacktrace((cmListFileBacktrace *)&entry.Backtrace.Snapshot.Position.Position,this);
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_c8,incs,";");
    cmValueWithOrigin::cmValueWithOrigin
              ((cmValueWithOrigin *)local_a8,&local_c8,
               (cmListFileBacktrace *)&entry.Backtrace.Snapshot.Position.Position);
    std::__cxx11::string::~string((string *)&local_c8);
    __gnu_cxx::
    __normal_iterator<cmValueWithOrigin_const*,std::vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>>>
    ::__normal_iterator<cmValueWithOrigin*>
              ((__normal_iterator<cmValueWithOrigin_const*,std::vector<cmValueWithOrigin,std::allocator<cmValueWithOrigin>>>
                *)&local_e0,
               (__normal_iterator<cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
                *)&lfbt.Snapshot.Position.Position);
    l.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
    ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
               )std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::insert
                          (&this->IncludeDirectoriesEntries,local_e0,(value_type *)local_a8);
    local_f0._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
         ::begin(&this->Targets);
    while( true ) {
      t = (cmTarget *)
          std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
          ::end(&this->Targets);
      bVar1 = std::__detail::operator!=
                        (&local_f0,
                         (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                          *)&t);
      if (!bVar1) break;
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                             *)&local_f0);
      cmTarget::InsertInclude(&ppVar2->second,(cmValueWithOrigin *)local_a8,before);
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
      ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                    *)&local_f0);
    }
    cmValueWithOrigin::~cmValueWithOrigin((cmValueWithOrigin *)local_a8);
    cmListFileBacktrace::~cmListFileBacktrace
              ((cmListFileBacktrace *)&entry.Backtrace.Snapshot.Position.Position);
  }
  return;
}

Assistant:

void cmMakefile::AddIncludeDirectories(const std::vector<std::string> &incs,
                                       bool before)
{
  if (incs.empty())
    {
    return;
    }

  std::vector<cmValueWithOrigin>::iterator position =
                              before ? this->IncludeDirectoriesEntries.begin()
                                    : this->IncludeDirectoriesEntries.end();

  cmListFileBacktrace lfbt = this->GetBacktrace();
  cmValueWithOrigin entry(cmJoin(incs, ";"), lfbt);
  this->IncludeDirectoriesEntries.insert(position, entry);

  // Property on each target:
  for (cmTargets::iterator l = this->Targets.begin();
       l != this->Targets.end(); ++l)
    {
    cmTarget &t = l->second;
    t.InsertInclude(entry, before);
    }
}